

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double log(double __x)

{
  ostream *poVar1;
  string *in_RSI;
  LogLevel in_EDI;
  double dVar2;
  string local_38;
  string *local_18;
  string *message_local;
  LogLevel ll_local;
  
  local_18 = in_RSI;
  to_string_abi_cxx11_(&local_38,in_EDI);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,local_18);
  std::operator<<(poVar1,'\n');
  dVar2 = (double)std::__cxx11::string::~string((string *)&local_38);
  return dVar2;
}

Assistant:

void log(LogLevel ll, const std::string& message) {
	std::cout << to_string(ll) << message << '\n';
}